

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cpp
# Opt level: O1

uint64_t __thiscall CSipHasher::Finalize(CSipHasher *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  
  uVar2 = this->v[1];
  uVar6 = (ulong)*(uint *)&this->count << 0x38 | this->tmp;
  uVar4 = this->v[3] ^ uVar6;
  uVar1 = this->v[0] + uVar2;
  uVar5 = this->v[2] + uVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    uVar3 = (uVar2 << 0xd | uVar2 >> 0x33) ^ uVar1;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar5;
    uVar2 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar4;
    uVar5 = uVar5 + uVar3;
    uVar1 = (uVar3 << 0x11 | uVar3 >> 0x2f) ^ uVar5;
    uVar4 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar2;
    uVar2 = uVar2 + uVar1;
    uVar1 = (uVar1 << 0xd | uVar1 >> 0x33) ^ uVar2;
    uVar5 = (uVar5 << 0x20 | uVar5 >> 0x20) + uVar4;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar5;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar4;
    uVar5 = uVar5 + uVar1;
    uVar4 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar2;
    uVar1 = (uVar1 << 0x11 | uVar1 >> 0x2f) ^ uVar5;
    uVar2 = (uVar2 ^ uVar6) + uVar1;
    uVar1 = (uVar1 << 0xd | uVar1 >> 0x33) ^ uVar2;
    uVar5 = ((uVar5 << 0x20 | uVar5 >> 0x20) ^ 0xff) + uVar4;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar5;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar4;
    uVar5 = uVar5 + uVar1;
    uVar1 = (uVar1 << 0x11 | uVar1 >> 0x2f) ^ uVar5;
    uVar4 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar2;
    uVar2 = uVar2 + uVar1;
    uVar1 = (uVar1 << 0xd | uVar1 >> 0x33) ^ uVar2;
    uVar5 = (uVar5 << 0x20 | uVar5 >> 0x20) + uVar4;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar5;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar4;
    uVar5 = uVar5 + uVar1;
    uVar1 = (uVar1 << 0x11 | uVar1 >> 0x2f) ^ uVar5;
    uVar4 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar2;
    uVar2 = uVar2 + uVar1;
    uVar1 = (uVar1 << 0xd | uVar1 >> 0x33) ^ uVar2;
    uVar5 = (uVar5 << 0x20 | uVar5 >> 0x20) + uVar4;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar5;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar4;
    uVar5 = uVar5 + uVar1;
    uVar1 = (uVar1 << 0x11 | uVar1 >> 0x2f) ^ uVar5;
    uVar4 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar2;
    uVar5 = (uVar5 << 0x20 | uVar5 >> 0x20) + uVar4;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar5;
    uVar2 = (uVar1 << 0xd | uVar1 >> 0x33) ^ uVar2 + uVar1;
    uVar5 = uVar5 + uVar2;
    return (uVar5 << 0x20 | uVar5 >> 0x20) ^ (uVar2 << 0x11 | uVar2 >> 0x2f) ^
           (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar5;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t CSipHasher::Finalize() const
{
    uint64_t v0 = v[0], v1 = v[1], v2 = v[2], v3 = v[3];

    uint64_t t = tmp | (((uint64_t)count) << 56);

    v3 ^= t;
    SIPROUND;
    SIPROUND;
    v0 ^= t;
    v2 ^= 0xFF;
    SIPROUND;
    SIPROUND;
    SIPROUND;
    SIPROUND;
    return v0 ^ v1 ^ v2 ^ v3;
}